

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.hpp
# Opt level: O0

void cfgfile::read_cfgfile<cfgfile::qstring_trait_t>
               (tag_t<cfgfile::qstring_trait_t> *tag,istream_t *stream,string_t *file_name)

{
  byte bVar1;
  qstring_wrapper_t *this;
  istream_t *in_RSI;
  parser_t<cfgfile::qstring_trait_t> parser_1;
  QString data;
  int column;
  int line;
  QString error;
  QDomDocument doc;
  parser_t<cfgfile::qstring_trait_t> parser;
  input_stream_t<cfgfile::qstring_trait_t> is;
  determine_format_t<cfgfile::qstring_trait_t> d;
  file_format_t fmt;
  string_t *in_stack_fffffffffffffd58;
  QString *other;
  input_stream_t<cfgfile::qstring_trait_t> *in_stack_fffffffffffffd60;
  undefined7 in_stack_fffffffffffffd68;
  undefined1 in_stack_fffffffffffffd6f;
  exception_t<cfgfile::qstring_trait_t> *in_stack_fffffffffffffd70;
  parser_t<cfgfile::qstring_trait_t> *this_00;
  char *in_stack_fffffffffffffd88;
  undefined4 in_stack_fffffffffffffd90;
  undefined4 in_stack_fffffffffffffd94;
  undefined4 uVar2;
  string_t *in_stack_fffffffffffffd98;
  input_stream_t<cfgfile::qstring_trait_t> *in_stack_fffffffffffffda0;
  QLatin1Char local_24b [3];
  undefined1 local_248 [25];
  QLatin1Char local_22f [4];
  QLatin1Char local_22b [3];
  QString local_228;
  undefined1 local_210 [24];
  undefined1 local_1f8 [24];
  undefined1 local_1e0 [24];
  undefined1 local_1c8 [24];
  undefined1 local_1b0 [48];
  undefined1 local_180 [24];
  int local_168;
  int local_164;
  undefined1 local_160 [24];
  QDomDocument local_148 [32];
  parser_t<cfgfile::qstring_trait_t> local_128 [32];
  determine_format_t<cfgfile::qstring_trait_t> local_28;
  file_format_t local_1c;
  
  local_1c = 0;
  details::determine_format_t<cfgfile::qstring_trait_t>::determine_format_t(&local_28,in_RSI);
  local_1c = details::determine_format_t<cfgfile::qstring_trait_t>::format
                       ((determine_format_t<cfgfile::qstring_trait_t> *)
                        CONCAT17(in_stack_fffffffffffffd6f,in_stack_fffffffffffffd68));
  qstring_trait_t::to_begin((istream_t *)0x114522);
  if (local_1c == cfgfile_format) {
    this_00 = local_128;
    input_stream_t<cfgfile::qstring_trait_t>::input_stream_t
              (in_stack_fffffffffffffda0,in_stack_fffffffffffffd98,
               (istream_t *)CONCAT44(in_stack_fffffffffffffd94,in_stack_fffffffffffffd90));
    parser_t<cfgfile::qstring_trait_t>::parser_t
              (this_00,(tag_t<cfgfile::qstring_trait_t> *)
                       CONCAT17(in_stack_fffffffffffffd6f,in_stack_fffffffffffffd68),
               in_stack_fffffffffffffd60);
    parser_t<cfgfile::qstring_trait_t>::parse
              ((parser_t<cfgfile::qstring_trait_t> *)in_stack_fffffffffffffd60,
               in_stack_fffffffffffffd58);
    parser_t<cfgfile::qstring_trait_t>::~parser_t((parser_t<cfgfile::qstring_trait_t> *)0x1145a7);
    input_stream_t<cfgfile::qstring_trait_t>::~input_stream_t(in_stack_fffffffffffffd60);
  }
  else if (local_1c == xml_format) {
    QDomDocument::QDomDocument(local_148);
    QString::QString((QString *)0x11461c);
    local_164 = 0;
    local_168 = 0;
    QTextStream::readAll();
    bVar1 = QDomDocument::setContent
                      ((QString *)local_148,SUB81(local_180,0),(QString *)0x1,(int *)local_160,
                       &local_164);
    if ((bVar1 & 1) == 0) {
      uVar2 = CONCAT31((int3)((uint)in_stack_fffffffffffffd94 >> 8),1);
      this = (qstring_wrapper_t *)__cxa_allocate_exception(0x28);
      QString::QString((QString *)CONCAT44(uVar2,in_stack_fffffffffffffd90),
                       in_stack_fffffffffffffd88);
      other = &local_228;
      qstring_wrapper_t::operator_cast_to_QString((qstring_wrapper_t *)other);
      QLatin1Char::QLatin1Char(local_22b,' ');
      QChar::QChar((QChar *)other,(QLatin1Char)(char)((ulong)this >> 0x38));
      QString::arg((QString *)local_1f8,(int)local_210,(QChar *)other);
      QLatin1Char::QLatin1Char(local_22f,' ');
      QChar::QChar((QChar *)other,(QLatin1Char)(char)((ulong)this >> 0x38));
      QString::arg((QString *)local_1e0,(int)local_1f8,(QChar *)local_160);
      QString::number((int)local_248,local_164);
      QLatin1Char::QLatin1Char(local_24b,' ');
      QChar::QChar((QChar *)other,(QLatin1Char)(char)((ulong)this >> 0x38));
      QString::arg((QString *)local_1c8,(int)local_1e0,(QChar *)local_248);
      QString::number((int)&stack0xfffffffffffffd98,local_168);
      QLatin1Char::QLatin1Char((QLatin1Char *)&stack0xfffffffffffffd95,' ');
      QChar::QChar((QChar *)other,(QLatin1Char)(char)((ulong)this >> 0x38));
      QString::arg((QString *)local_1b0,(int)local_1c8,(QChar *)&stack0xfffffffffffffd98);
      qstring_wrapper_t::qstring_wrapper_t(this,other);
      exception_t<cfgfile::qstring_trait_t>::exception_t
                (in_stack_fffffffffffffd70,(string_t *)CONCAT17(bVar1,in_stack_fffffffffffffd68));
      __cxa_throw(this,&exception_t<cfgfile::qstring_trait_t>::typeinfo,
                  exception_t<cfgfile::qstring_trait_t>::~exception_t);
    }
    parser_t<cfgfile::qstring_trait_t>::parser_t
              ((parser_t<cfgfile::qstring_trait_t> *)in_stack_fffffffffffffd70,
               (tag_t<cfgfile::qstring_trait_t> *)CONCAT17(bVar1,in_stack_fffffffffffffd68),
               (QDomDocument *)in_stack_fffffffffffffd60);
    parser_t<cfgfile::qstring_trait_t>::parse
              ((parser_t<cfgfile::qstring_trait_t> *)in_stack_fffffffffffffd60,
               in_stack_fffffffffffffd58);
    parser_t<cfgfile::qstring_trait_t>::~parser_t((parser_t<cfgfile::qstring_trait_t> *)0x114a1f);
    QString::~QString((QString *)0x114a2c);
    QString::~QString((QString *)0x114a39);
    QDomDocument::~QDomDocument(local_148);
  }
  return;
}

Assistant:

static inline void read_cfgfile(
	//! Configuration tag.
	tag_t< Trait > & tag,
	//! Stream.
	typename Trait::istream_t & stream,
	//! File name.
	const typename Trait::string_t & file_name )
{
	file_format_t fmt = file_format_t::cfgfile_format;

	{
		details::determine_format_t< Trait > d( stream );

		fmt = d.format();
	}

	Trait::to_begin( stream );

	switch( fmt )
	{
		case file_format_t::cfgfile_format :
		{
			input_stream_t< Trait > is( file_name, stream );

			parser_t< Trait > parser( tag, is );

			parser.parse( file_name );
		}
			break;

		case file_format_t::xml_format :
		{
#ifdef CFGFILE_QT_SUPPORT
#ifdef CFGFILE_XML_SUPPORT
			QDomDocument doc;

			QString error;
			int line = 0;
			int column = 0;

			const QString data = stream.readAll();

			if( !doc.setContent( data, true, &error, &line, &column ) )
				throw exception_t< Trait >( QString( "Unable to parse XML "
					"from file: \"%1\". \"%2\" On line %3, column %4." )
						.arg( file_name )
						.arg( error )
						.arg( QString::number( line ) )
						.arg( QString::number( column ) ) );

			parser_t< Trait > parser( tag, doc );

			parser.parse( file_name );
#else
			throw exception_t< Trait >(
				Trait::from_ascii( "To use XML format build cfgfile "
					"with CFGFILE_XML_SUPPORT" ) );
#endif // CFGFILE_XML_SUPPORT
#else
			throw exception_t< Trait >(
				Trait::from_ascii( "XML supported only with Qt. Parsing of file \"" ) +
				file_name + Trait::from_ascii( "\" failed." ) );
#endif // CFGFILE_QT_SUPPORT
		}
			break;
	}
}